

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O1

int xmlValidatePushElement(xmlValidCtxtPtr ctxt,xmlDocPtr doc,xmlNodePtr elem,xmlChar *qname)

{
  xmlElementPtr pxVar1;
  _xmlElementContent *p_Var2;
  bool bVar3;
  int iVar4;
  xmlNodePtr pxVar5;
  xmlValidState *pxVar6;
  xmlRegExecCtxtPtr pxVar7;
  char *msg;
  xmlParserErrors error;
  xmlChar *pxVar8;
  xmlElementContentPtr pxVar9;
  int iVar10;
  int extsubset;
  int local_40 [2];
  xmlChar *local_38;
  
  local_40[1] = 0;
  if (ctxt == (xmlValidCtxtPtr)0x0) {
    return 0;
  }
  iVar10 = 1;
  if (((ctxt->vstateNr < 1) || (pxVar6 = ctxt->vstate, pxVar6 == (xmlValidState *)0x0)) ||
     (pxVar1 = pxVar6->elemDecl, pxVar1 == (xmlElementPtr)0x0)) goto switchD_00197bff_caseD_2;
  switch(pxVar1->etype) {
  case XML_ELEMENT_TYPE_EMPTY:
    pxVar5 = pxVar6->node;
    pxVar8 = pxVar5->name;
    msg = "Element %s was declared EMPTY this one has content\n";
    error = XML_DTD_NOT_EMPTY;
    goto LAB_00197c6f;
  default:
    break;
  case XML_ELEMENT_TYPE_MIXED:
    pxVar9 = pxVar1->content;
    if ((pxVar9 == (xmlElementContentPtr)0x0) || (pxVar9->type != XML_ELEMENT_CONTENT_PCDATA)) {
      local_38 = xmlSplitQName3(qname,local_40);
      if (local_38 == (xmlChar *)0x0) {
        if (pxVar9 != (xmlElementContentPtr)0x0) {
          do {
            if (pxVar9->type == XML_ELEMENT_CONTENT_OR) {
              p_Var2 = pxVar9->c1;
              if ((p_Var2 == (_xmlElementContent *)0x0) ||
                 (p_Var2->type != XML_ELEMENT_CONTENT_ELEMENT)) {
                if ((p_Var2 == (_xmlElementContent *)0x0) ||
                   (p_Var2->type != XML_ELEMENT_CONTENT_PCDATA)) goto LAB_00197e27;
              }
              else if (p_Var2->prefix == (xmlChar *)0x0) {
                pxVar8 = p_Var2->name;
                goto LAB_00197dd1;
              }
            }
            else {
              if (pxVar9->type != XML_ELEMENT_CONTENT_ELEMENT) {
LAB_00197e27:
                __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,
                                (void *)0x0,(void *)0x0,0x17,0x207,XML_ERR_ERROR,(char *)0x0,0,
                                (char *)0x0,(char *)0x0,(char *)0x0,0,0,"%s",
                                "Internal: MIXED struct corrupted\n");
                break;
              }
              if (pxVar9->prefix == (xmlChar *)0x0) {
                pxVar8 = pxVar9->name;
LAB_00197dd1:
                iVar4 = xmlStrEqual(pxVar8,qname);
                if (iVar4 != 0) goto LAB_00198003;
              }
            }
            pxVar9 = pxVar9->c2;
          } while (pxVar9 != (_xmlElementContent *)0x0);
          goto LAB_00197e8a;
        }
      }
      else if (pxVar9 != (xmlElementContentPtr)0x0) {
        do {
          if (pxVar9->type == XML_ELEMENT_CONTENT_OR) {
            p_Var2 = pxVar9->c1;
            if ((p_Var2 == (_xmlElementContent *)0x0) ||
               (p_Var2->type != XML_ELEMENT_CONTENT_ELEMENT)) {
              if ((p_Var2 == (_xmlElementContent *)0x0) ||
                 (p_Var2->type != XML_ELEMENT_CONTENT_PCDATA)) goto LAB_00197e0c;
            }
            else if ((p_Var2->prefix != (xmlChar *)0x0) &&
                    (iVar4 = xmlStrncmp(p_Var2->prefix,qname,local_40[0]), iVar4 == 0)) {
              pxVar8 = pxVar9->c1->name;
              goto LAB_00197d59;
            }
          }
          else {
            if (pxVar9->type != XML_ELEMENT_CONTENT_ELEMENT) {
LAB_00197e0c:
              xmlErrValid(ctxt,XML_DTD_MIXED_CORRUPT,"Internal: MIXED struct corrupted\n",
                          (char *)0x0);
              break;
            }
            if ((pxVar9->prefix != (xmlChar *)0x0) &&
               (iVar4 = xmlStrncmp(pxVar9->prefix,qname,local_40[0]), iVar4 == 0)) {
              pxVar8 = pxVar9->name;
LAB_00197d59:
              iVar4 = xmlStrEqual(pxVar8,local_38);
              if (iVar4 != 0) goto LAB_00198003;
            }
          }
          pxVar9 = pxVar9->c2;
        } while (pxVar9 != (_xmlElementContent *)0x0);
LAB_00197e8a:
        iVar4 = 0;
        bVar3 = true;
        goto LAB_00197e8c;
      }
      bVar3 = true;
      iVar4 = 0;
      goto LAB_00197e8c;
    }
    pxVar5 = pxVar6->node;
    pxVar8 = pxVar5->name;
    msg = "Element %s was declared #PCDATA but contains non text nodes\n";
    error = XML_DTD_NOT_PCDATA;
LAB_00197c6f:
    xmlErrValidNode(ctxt,pxVar5,error,msg,pxVar8,(xmlChar *)0x0,(xmlChar *)0x0);
    iVar10 = 0;
    break;
  case XML_ELEMENT_TYPE_ELEMENT:
    if ((pxVar6->exec == (xmlRegExecCtxtPtr)0x0) ||
       (iVar4 = xmlRegExecPushString(pxVar6->exec,qname,(void *)0x0), -1 < iVar4)) break;
    xmlErrValidNode(ctxt,pxVar6->node,XML_DTD_CONTENT_MODEL,
                    "Element %s content does not follow the DTD, Misplaced %s\n",pxVar6->node->name,
                    qname,(xmlChar *)0x0);
  case XML_ELEMENT_TYPE_UNDEFINED:
    iVar10 = 0;
  }
switchD_00197bff_caseD_2:
  pxVar5 = (xmlNodePtr)xmlValidGetElemDecl(ctxt,doc,elem,local_40 + 1);
  if ((ctxt->vstateMax == 0) || (ctxt->vstateTab == (xmlValidState *)0x0)) {
    ctxt->vstateMax = 10;
    pxVar6 = (xmlValidState *)(*xmlMalloc)(0xf0);
    ctxt->vstateTab = pxVar6;
    if (pxVar6 == (xmlValidState *)0x0) {
      xmlVErrMemory(ctxt,"malloc failed");
      return iVar10;
    }
  }
  if (ctxt->vstateMax <= ctxt->vstateNr) {
    pxVar6 = (xmlValidState *)(*xmlRealloc)(ctxt->vstateTab,(long)ctxt->vstateMax * 0x30);
    if (pxVar6 == (xmlValidState *)0x0) {
      xmlVErrMemory(ctxt,"realloc failed");
      return iVar10;
    }
    ctxt->vstateMax = ctxt->vstateMax << 1;
    ctxt->vstateTab = pxVar6;
  }
  pxVar6 = ctxt->vstateTab + ctxt->vstateNr;
  ctxt->vstate = pxVar6;
  pxVar6->elemDecl = (xmlElementPtr)pxVar5;
  pxVar6->node = elem;
  if ((pxVar5 != (xmlNodePtr)0x0) && (*(int *)&pxVar5->ns == 4)) {
    if (pxVar5->psvi == (void *)0x0) {
      xmlValidBuildContentModel(ctxt,(xmlElementPtr)pxVar5);
    }
    if ((xmlRegexpPtr)pxVar5->psvi == (xmlRegexpPtr)0x0) {
      ctxt->vstateTab[ctxt->vstateNr].exec = (xmlRegExecCtxtPtr)0x0;
      xmlErrValidNode(ctxt,pxVar5,XML_ERR_INTERNAL_ERROR,
                      "Failed to build content model regexp for %s\n",elem->name,(xmlChar *)0x0,
                      (xmlChar *)0x0);
    }
    else {
      pxVar7 = xmlRegNewExecCtxt((xmlRegexpPtr)pxVar5->psvi,(xmlRegExecCallbacks)0x0,(void *)0x0);
      ctxt->vstateTab[ctxt->vstateNr].exec = pxVar7;
    }
  }
  ctxt->vstateNr = ctxt->vstateNr + 1;
  return iVar10;
LAB_00198003:
  iVar4 = 1;
  bVar3 = false;
LAB_00197e8c:
  if (bVar3) {
    xmlErrValidNode(ctxt,pxVar6->node,XML_DTD_INVALID_CHILD,
                    "Element %s is not declared in %s list of possible children\n",qname,
                    pxVar6->node->name,(xmlChar *)0x0);
    iVar10 = iVar4;
  }
  goto switchD_00197bff_caseD_2;
}

Assistant:

int
xmlValidatePushElement(xmlValidCtxtPtr ctxt, xmlDocPtr doc,
                       xmlNodePtr elem, const xmlChar *qname) {
    int ret = 1;
    xmlElementPtr eDecl;
    int extsubset = 0;

    if (ctxt == NULL)
        return(0);
/* printf("PushElem %s\n", qname); */
    if ((ctxt->vstateNr > 0) && (ctxt->vstate != NULL)) {
	xmlValidStatePtr state = ctxt->vstate;
	xmlElementPtr elemDecl;

	/*
	 * Check the new element against the content model of the new elem.
	 */
	if (state->elemDecl != NULL) {
	    elemDecl = state->elemDecl;

	    switch(elemDecl->etype) {
		case XML_ELEMENT_TYPE_UNDEFINED:
		    ret = 0;
		    break;
		case XML_ELEMENT_TYPE_EMPTY:
		    xmlErrValidNode(ctxt, state->node,
				    XML_DTD_NOT_EMPTY,
	       "Element %s was declared EMPTY this one has content\n",
			   state->node->name, NULL, NULL);
		    ret = 0;
		    break;
		case XML_ELEMENT_TYPE_ANY:
		    /* I don't think anything is required then */
		    break;
		case XML_ELEMENT_TYPE_MIXED:
		    /* simple case of declared as #PCDATA */
		    if ((elemDecl->content != NULL) &&
			(elemDecl->content->type ==
			 XML_ELEMENT_CONTENT_PCDATA)) {
			xmlErrValidNode(ctxt, state->node,
					XML_DTD_NOT_PCDATA,
	       "Element %s was declared #PCDATA but contains non text nodes\n",
				state->node->name, NULL, NULL);
			ret = 0;
		    } else {
			ret = xmlValidateCheckMixed(ctxt, elemDecl->content,
				                    qname);
			if (ret != 1) {
			    xmlErrValidNode(ctxt, state->node,
					    XML_DTD_INVALID_CHILD,
	       "Element %s is not declared in %s list of possible children\n",
				    qname, state->node->name, NULL);
			}
		    }
		    break;
		case XML_ELEMENT_TYPE_ELEMENT:
		    /*
		     * TODO:
		     * VC: Standalone Document Declaration
		     *     - element types with element content, if white space
		     *       occurs directly within any instance of those types.
		     */
		    if (state->exec != NULL) {
			ret = xmlRegExecPushString(state->exec, qname, NULL);
			if (ret < 0) {
			    xmlErrValidNode(ctxt, state->node,
					    XML_DTD_CONTENT_MODEL,
	       "Element %s content does not follow the DTD, Misplaced %s\n",
				   state->node->name, qname, NULL);
			    ret = 0;
			} else {
			    ret = 1;
			}
		    }
		    break;
	    }
	}
    }
    eDecl = xmlValidGetElemDecl(ctxt, doc, elem, &extsubset);
    vstateVPush(ctxt, eDecl, elem);
    return(ret);
}